

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5ApiPhraseNext(Fts5Context *pUnused,Fts5PhraseIter *pIter,int *piCol,int *piOff)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  uchar *puVar3;
  int iVal;
  u32 local_34;
  
  local_34 = (u32)((ulong)in_RAX >> 0x20);
  puVar3 = pIter->a;
  if (puVar3 < pIter->b) {
    uVar1 = sqlite3Fts5GetVarint32(puVar3,&local_34);
    puVar3 = puVar3 + uVar1;
    pIter->a = puVar3;
    if (local_34 == 1) {
      uVar1 = sqlite3Fts5GetVarint32(puVar3,&local_34);
      puVar3 = puVar3 + uVar1;
      pIter->a = puVar3;
      *piCol = local_34;
      *piOff = 0;
      uVar1 = sqlite3Fts5GetVarint32(puVar3,&local_34);
      pIter->a = puVar3 + uVar1;
      iVar2 = 0;
    }
    else {
      iVar2 = *piOff;
    }
    iVar2 = local_34 + iVar2 + -2;
  }
  else {
    iVar2 = -1;
    *piCol = -1;
  }
  *piOff = iVar2;
  return;
}

Assistant:

static void fts5ApiPhraseNext(
  Fts5Context *pUnused, 
  Fts5PhraseIter *pIter, 
  int *piCol, int *piOff
){
  UNUSED_PARAM(pUnused);
  if( pIter->a>=pIter->b ){
    *piCol = -1;
    *piOff = -1;
  }else{
    int iVal;
    pIter->a += fts5GetVarint32(pIter->a, iVal);
    if( iVal==1 ){
      pIter->a += fts5GetVarint32(pIter->a, iVal);
      *piCol = iVal;
      *piOff = 0;
      pIter->a += fts5GetVarint32(pIter->a, iVal);
    }
    *piOff += (iVal-2);
  }
}